

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O2

int glfwInit(void)

{
  int iVar1;
  
  if (_glfwInitialized == '\0') {
    memset(&_glfw,0,0x8b8);
    iVar1 = _glfwPlatformInit();
    if (iVar1 != 0) {
      _glfw.monitors = _glfwPlatformGetMonitors(&_glfw.monitorCount);
      if (_glfw.monitorCount != 0) {
        _glfwInitialized = '\x01';
        glfwDefaultWindowHints();
        goto LAB_001dd4f8;
      }
      _glfwInputError(0x10008,"No monitors found");
    }
    iVar1 = 0;
    _glfwPlatformTerminate();
  }
  else {
LAB_001dd4f8:
    iVar1 = 1;
  }
  return iVar1;
}

Assistant:

GLFWAPI int glfwInit(void)
{
    if (_glfwInitialized)
        return GL_TRUE;

    memset(&_glfw, 0, sizeof(_glfw));

    if (!_glfwPlatformInit())
    {
        _glfwPlatformTerminate();
        return GL_FALSE;
    }

    _glfw.monitors = _glfwPlatformGetMonitors(&_glfw.monitorCount);
    if (!_glfw.monitorCount)
    {
        _glfwInputError(GLFW_PLATFORM_ERROR, "No monitors found");
        _glfwPlatformTerminate();
        return GL_FALSE;
    }

    _glfwInitialized = GL_TRUE;

    // Not all window hints have zero as their default value
    glfwDefaultWindowHints();

    return GL_TRUE;
}